

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O1

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::get_back,_char32_t,_char32_t> *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  char32_t *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  size_type sVar6;
  char32_t *pcVar7;
  size_type sVar8;
  
  sVar6 = str->_M_string_length;
  if (sVar6 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    pcVar7 = pcVar2;
    sVar8 = sVar6;
    do {
      if (*pcVar7 == info->delim) goto LAB_001a9ee7;
      pcVar7 = pcVar7 + 1;
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
    pcVar7 = (char32_t *)0x0;
LAB_001a9ee7:
    if ((long)pcVar7 - (long)pcVar2 != -4 && pcVar7 != (char32_t *)0x0) {
      sVar6 = sVar6 + 1;
      do {
        if (sVar6 == 1) {
          sVar8 = 0;
          break;
        }
        sVar8 = sVar6 - 1;
        lVar5 = sVar6 - 2;
        sVar6 = sVar8;
      } while ((str->_M_dataplus)._M_p[lVar5] != info->delim);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      erase(str,0,sVar8);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = L'\0';
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<get_back, DelimType, CharType>& info)
	{
		const auto pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos != pos) str.erase(0, str.find_last_of(info.delim) + 1);
		return std::move(str);
	}